

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_jp2_t * opj_jp2_create(OPJ_BOOL p_is_decoder)

{
  opj_j2k_t *poVar1;
  opj_procedure_list_t *poVar2;
  opj_jp2_t *jp2;
  opj_jp2_t *poStack_10;
  OPJ_BOOL p_is_decoder_local;
  
  poStack_10 = (opj_jp2_t *)opj_calloc(1,0xb0);
  if (poStack_10 != (opj_jp2_t *)0x0) {
    if (p_is_decoder == 0) {
      poVar1 = opj_j2k_create_compress();
      poStack_10->j2k = poVar1;
    }
    else {
      poVar1 = opj_j2k_create_decompress();
      poStack_10->j2k = poVar1;
    }
    if (poStack_10->j2k == (opj_j2k_t *)0x0) {
      opj_jp2_destroy(poStack_10);
      poStack_10 = (opj_jp2_t *)0x0;
    }
    else {
      (poStack_10->color).icc_profile_buf = (OPJ_BYTE *)0x0;
      (poStack_10->color).icc_profile_len = 0;
      (poStack_10->color).jp2_cdef = (opj_jp2_cdef_t *)0x0;
      (poStack_10->color).jp2_pclr = (opj_jp2_pclr_t *)0x0;
      (poStack_10->color).jp2_has_colr = '\0';
      poVar2 = opj_procedure_list_create();
      poStack_10->m_validation_list = poVar2;
      if (poStack_10->m_validation_list == (opj_procedure_list *)0x0) {
        opj_jp2_destroy(poStack_10);
        poStack_10 = (opj_jp2_t *)0x0;
      }
      else {
        poVar2 = opj_procedure_list_create();
        poStack_10->m_procedure_list = poVar2;
        if (poStack_10->m_procedure_list == (opj_procedure_list *)0x0) {
          opj_jp2_destroy(poStack_10);
          poStack_10 = (opj_jp2_t *)0x0;
        }
      }
    }
  }
  return poStack_10;
}

Assistant:

opj_jp2_t* opj_jp2_create(OPJ_BOOL p_is_decoder)
{
    opj_jp2_t *jp2 = (opj_jp2_t*)opj_calloc(1, sizeof(opj_jp2_t));
    if (jp2) {

        /* create the J2K codec */
        if (! p_is_decoder) {
            jp2->j2k = opj_j2k_create_compress();
        } else {
            jp2->j2k = opj_j2k_create_decompress();
        }

        if (jp2->j2k == 00) {
            opj_jp2_destroy(jp2);
            return 00;
        }

        /* Color structure */
        jp2->color.icc_profile_buf = NULL;
        jp2->color.icc_profile_len = 0;
        jp2->color.jp2_cdef = NULL;
        jp2->color.jp2_pclr = NULL;
        jp2->color.jp2_has_colr = 0;

        /* validation list creation */
        jp2->m_validation_list = opj_procedure_list_create();
        if (! jp2->m_validation_list) {
            opj_jp2_destroy(jp2);
            return 00;
        }

        /* execution list creation */
        jp2->m_procedure_list = opj_procedure_list_create();
        if (! jp2->m_procedure_list) {
            opj_jp2_destroy(jp2);
            return 00;
        }
    }

    return jp2;
}